

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

bool __thiscall
dap::BasicTypeInfo<dap::optional<dap::ValueFormat>_>::deserialize
          (BasicTypeInfo<dap::optional<dap::ValueFormat>_> *this,Deserializer *d,void *ptr)

{
  int iVar1;
  TypeInfo *pTVar2;
  ValueFormat v;
  undefined2 local_1a;
  
  local_1a = 0;
  pTVar2 = TypeOf<dap::ValueFormat>::type();
  iVar1 = (*pTVar2->_vptr_TypeInfo[8])(pTVar2,d,&local_1a);
  if ((char)iVar1 != '\0') {
    *(undefined1 *)ptr = (undefined1)local_1a;
    *(undefined1 *)((long)ptr + 1) = local_1a._1_1_;
    *(undefined1 *)((long)ptr + 2) = 1;
  }
  return true;
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }